

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O0

union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_union_iterator<std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>>,std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>>>>&>
          (union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>
          *ranges)

{
  iterator this_00;
  iterator first;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>
  in_RCX;
  vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>
  *ranges_local;
  
  this_00 = std::
            begin<std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>>,std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>>>>>
                      ((vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>
                        *)this);
  first = std::
          end<std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>>,std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>>>>>
                    ((vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>
                      *)this);
  make_union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>>*,std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>>,std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>>>>>>
            (__return_storage_ptr__,(burst *)this_00._M_current,
             (__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>
              )first._M_current,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto make_union_iterator (RandomAccessRange && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_union_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges))
            );
    }